

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqoptimizer.cpp
# Opt level: O2

void __thiscall SQOptimizer::optimize(SQOptimizer *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  SQFuncState *pSVar3;
  SQInstruction *pSVar4;
  Jump *pJVar5;
  uint uVar6;
  int iVar8;
  long lVar9;
  int i;
  ulong uVar10;
  float fVar11;
  undefined1 local_58 [8];
  SQObjectValue SStack_50;
  undefined4 local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar7;
  
  this->codeChanged = true;
  uVar10 = 0;
  do {
    if (((int)uVar10 == 2) || (this->codeChanged == false)) {
      optimizeJumpFolding(this);
      return;
    }
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    SStack_50.pTable = (SQTable *)0x0;
    local_48 = 0;
    local_40 = uVar10;
    sqvector<SQOptimizer::Jump,_unsigned_int>::resize(&this->jumps,0,(Jump *)local_58);
    pSVar3 = this->fs;
    for (uVar10 = 0; uVar10 < (pSVar3->_instructions)._size; uVar10 = uVar10 + 1) {
      pSVar4 = (pSVar3->_instructions)._vals;
      uVar6 = pSVar4[uVar10].op - 0x22;
      uVar7 = (ulong)uVar6;
      if (uVar6 < 0x27) {
        iVar8 = (int)uVar10;
        if ((0x138180033U >> (uVar7 & 0x3f) & 1) == 0) {
          if ((0xcUL >> (uVar7 & 0x3f) & 1) == 0) {
            if (uVar7 != 0x26) goto LAB_0015d83c;
            SStack_50.fFloat = (SQFloat)(pSVar4[uVar10].field_0._arg1 + iVar8);
            SStack_50.nInteger._4_4_ = pSVar4[uVar10].field_0._arg1 + iVar8;
            goto LAB_0015d827;
          }
          SStack_50.nInteger._4_4_ = (char)pSVar4[uVar10]._arg0 + iVar8 + 1;
          SStack_50.nInteger._0_4_ = SStack_50.nInteger._4_4_;
          local_48 = CONCAT22(local_48._2_2_,0x100);
        }
        else {
          SStack_50.fFloat = (SQFloat)(pSVar4[uVar10].field_0._arg1 + iVar8 + 1);
          SStack_50.nInteger._4_4_ = pSVar4[uVar10].field_0._arg1 + iVar8 + 1;
LAB_0015d827:
          local_48 = (uint)local_48._2_2_ << 0x10;
        }
        local_58._4_4_ = iVar8;
        local_58._0_4_ = iVar8;
        sqvector<SQOptimizer::Jump,_unsigned_int>::push_back(&this->jumps,(Jump *)local_58);
      }
LAB_0015d83c:
    }
    this->codeChanged = false;
    optimizeConstFolding(this);
    optimizeEmptyJumps(this);
    if (this->codeChanged == true) {
      lVar9 = 0;
      for (uVar10 = 0; uVar10 < (this->jumps)._size; uVar10 = uVar10 + 1) {
        pJVar5 = (this->jumps)._vals;
        if ((&pJVar5->modified)[lVar9] == true) {
          uVar6 = *(uint *)((long)&pJVar5->instructionIndex + lVar9);
          iVar8 = (*(int *)((long)&pJVar5->originalInstructionIndex + lVar9) - uVar6) +
                  (*(int *)((long)&pJVar5->jumpTo + lVar9) -
                  *(int *)((long)&pJVar5->originalJumpTo + lVar9));
          pSVar4 = (pSVar3->_instructions)._vals;
          fVar11 = (float)pSVar4[uVar6].field_0._arg1;
          if ((&pJVar5->jumpArg)[lVar9] == JUMP_ARG1) {
            pSVar4[uVar6].field_0._arg1 = (int)fVar11 + iVar8;
          }
          else {
            uVar1 = pSVar4[uVar6].op;
            uVar2 = pSVar4[uVar6]._arg0;
            iVar8 = (char)uVar2 + iVar8;
            if ((char)(uchar)iVar8 == iVar8) {
              pSVar4[uVar6]._arg0 = (uchar)iVar8;
            }
            else if ((uVar1 & 0xfe) == 0x24) {
              if (uVar1 != 0x25) {
                fVar11 = (float)(int)fVar11;
              }
              local_58._0_5_ = 0x5000004;
              SStack_50.nInteger._4_4_ = 0;
              SStack_50.fFloat = fVar11;
              local_38 = SQFuncState::GetConstant(this->fs,(SQObject *)local_58,0xff);
              SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_58);
              if ((local_38 & 0xffffff00) == 0) {
                pJVar5 = (this->jumps)._vals;
                (&pJVar5->jumpArg)[lVar9] = JUMP_ARG1;
                (pSVar3->_instructions)._vals[*(uint *)((long)&pJVar5->instructionIndex + lVar9)].
                field_0._arg1 = iVar8;
                uVar6 = *(uint *)((long)&((this->jumps)._vals)->instructionIndex + lVar9);
                pSVar4 = (pSVar3->_instructions)._vals;
                pSVar4[uVar6]._arg0 = (uchar)local_38;
                pSVar4[uVar6].op = '&';
              }
            }
          }
        }
        lVar9 = lVar9 + 0x14;
      }
    }
    uVar10 = (ulong)((int)local_40 + 1);
  } while( true );
}

Assistant:

void SQOptimizer::optimize()
{
    codeChanged = true;
    for (int pass = 0; pass < 2 && codeChanged; pass++) {
        jumps.resize(0);
        SQInstructionVec & instr = fs->_instructions;
        for (int i = 0; i < instr.size(); i++)
            switch (instr[i].op) {
                case _OP_JMP:
                case _OP_JCMP:
                case _OP_JCMPK:
                case _OP_JZ:
                case _OP_AND:
                case _OP_OR:
                case _OP_PUSHTRAP:
                case _OP_FOREACH:
                case _OP_PREFOREACH:
                case _OP_POSTFOREACH:
                    jumps.push_back({i, i, i + instr[i]._arg1 + 1, i + instr[i]._arg1 + 1, false, JumpArg::JUMP_ARG1});
                    break;
                case _OP_JCMPI:
                case _OP_JCMPF:
                    jumps.push_back({i, i, i + instr[i]._sarg0() + 1, i + instr[i]._sarg0() + 1, false, JumpArg::JUMP_ARG0});
                    break;
                case _OP_NULLCOALESCE:
                    jumps.push_back({i, i, i + instr[i]._arg1, i + instr[i]._arg1, false, JumpArg::JUMP_ARG1});
                    break;
                default:
                    break;
            }

        codeChanged = false;
        optimizeConstFolding();
        optimizeEmptyJumps();

        if (codeChanged)
            for (int i = 0; i < jumps.size(); i++)
                if (jumps[i].modified) {
                    const int change = (jumps[i].jumpTo - jumps[i].originalJumpTo) - (jumps[i].instructionIndex - jumps[i].originalInstructionIndex);
                    if (jumps[i].jumpArg == JumpArg::JUMP_ARG1)
                        instr[jumps[i].instructionIndex]._arg1 += change;
                    else {
                        const SQInstruction originalJump = instr[jumps[i].instructionIndex];
                        const int nextJumpVal = originalJump._sarg0() + change;
                        if (nextJumpVal >= -128 && nextJumpVal <= 127)
                        {
                            instr[jumps[i].instructionIndex]._arg0 = nextJumpVal; // still fit
                        } else if (instr[jumps[i].instructionIndex].op == _OP_JCMPF || instr[jumps[i].instructionIndex].op == _OP_JCMPI) {
                            const uint32_t constI = fs->GetConstant(SQObjectPtr(instr[jumps[i].instructionIndex].op == _OP_JCMPF ? originalJump._farg1 : (SQInteger)originalJump._arg1), 255);
                            if (constI <= 255u) // we still fit in const table
                            {
                              jumps[i].jumpArg = JumpArg::JUMP_ARG1;
                              instr[jumps[i].instructionIndex]._arg1 = nextJumpVal;
                              instr[jumps[i].instructionIndex]._arg0 = constI;
                              instr[jumps[i].instructionIndex].op = _OP_JCMPK;
                            } else
                              assert(0);//todo: we need to convert back to OP_JCMP, and we need to generate load instruction for that
                        } else
                          assert(0);//todo: we need to convert back to OP_JCMP, and we need to generate load instruction for that
                    }
                }
    }

    optimizeJumpFolding();

#ifdef _DEBUG_DUMP
    for (int i = 0; i < jumps.size(); i++)
        printf(_SC("JUMPS:  instruction: %d  to: %d\n"), jumps[i].instructionIndex, jumps[i].jumpTo);
#endif

}